

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::FixOptionsForMessage
          (Generator *this,Descriptor *descriptor)

{
  bool bVar1;
  int i;
  long lVar2;
  long lVar3;
  string descriptor_name;
  string message_options;
  string local_60;
  string local_40;
  
  lVar3 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(descriptor + 0x70); lVar2 = lVar2 + 1) {
    FixOptionsForMessage(this,(Descriptor *)(*(long *)(descriptor + 0x38) + lVar3));
    lVar3 = lVar3 + 0x88;
  }
  lVar3 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(descriptor + 0x68); lVar2 = lVar2 + 1) {
    FixOptionsForOneof(this,(OneofDescriptor *)(*(long *)(descriptor + 0x30) + lVar3));
    lVar3 = lVar3 + 0x28;
  }
  lVar3 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(descriptor + 0x74); lVar2 = lVar2 + 1) {
    FixOptionsForEnum(this,(EnumDescriptor *)(*(long *)(descriptor + 0x40) + lVar3));
    lVar3 = lVar3 + 0x48;
  }
  lVar3 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(descriptor + 4); lVar2 = lVar2 + 1) {
    FixOptionsForField(this,(FieldDescriptor *)(*(long *)(descriptor + 0x28) + lVar3));
    lVar3 = lVar3 + 0x48;
  }
  lVar3 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(descriptor + 0x7c); lVar2 = lVar2 + 1) {
    FixOptionsForField(this,(FieldDescriptor *)(*(long *)(descriptor + 0x50) + lVar3));
    lVar3 = lVar3 + 0x48;
  }
  MessageLite::SerializeAsString_abi_cxx11_(&local_60,*(MessageLite **)(descriptor + 0x20));
  OptionsValue(&local_40,this,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  bVar1 = std::operator!=(&local_40,"None");
  if (bVar1) {
    ModuleLevelDescriptorName<google::protobuf::Descriptor>(&local_60,this,descriptor);
    anon_unknown_0::PrintDescriptorOptionsFixingCode(&local_60,&local_40,this->printer_);
    std::__cxx11::string::~string((string *)&local_60);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void Generator::FixOptionsForMessage(const Descriptor& descriptor) const {
  // Nested messages.
  for (int i = 0; i < descriptor.nested_type_count(); ++i) {
    FixOptionsForMessage(*descriptor.nested_type(i));
  }
  // Oneofs.
  for (int i = 0; i < descriptor.oneof_decl_count(); ++i) {
    FixOptionsForOneof(*descriptor.oneof_decl(i));
  }
  // Enums.
  for (int i = 0; i < descriptor.enum_type_count(); ++i) {
    FixOptionsForEnum(*descriptor.enum_type(i));
  }
  // Fields.
  for (int i = 0; i < descriptor.field_count(); ++i) {
    const FieldDescriptor& field = *descriptor.field(i);
    FixOptionsForField(field);
  }
  // Extensions.
  for (int i = 0; i < descriptor.extension_count(); ++i) {
    const FieldDescriptor& field = *descriptor.extension(i);
    FixOptionsForField(field);
  }
  // Message option for this message.
  std::string message_options =
      OptionsValue(descriptor.options().SerializeAsString());
  if (message_options != "None") {
    std::string descriptor_name = ModuleLevelDescriptorName(descriptor);
    PrintDescriptorOptionsFixingCode(descriptor_name, message_options,
                                     printer_);
  }
}